

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IBMPC.cpp
# Opt level: O3

int GetFormatGap(int drive_speed,DataRate datarate,Encoding encoding,int sectors,int size_)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  
  if (sectors == 0) {
    return 0;
  }
  lVar4 = 0x14;
  while ((((*(int *)("FitTrack: unable to fit " + lVar4 + 5) != drive_speed ||
           (*(DataRate *)("FitTrack: unable to fit " + lVar4 + 9) != datarate)) ||
          (*(Encoding *)("FitTrack: unable to fit " + lVar4 + 0xd) != encoding)) ||
         ((*(int *)("FitTrack: unable to fit " + lVar4 + 0x11) != sectors ||
          (*(int *)("FitTrack: unable to fit " + lVar4 + 0x15) != size_))))) {
    lVar4 = lVar4 + 0x18;
    if (lVar4 == 0x5c) {
      iVar1 = GetRawTrackCapacity(drive_speed,datarate,encoding);
      iVar3 = iVar1 * 0x7cb >> 0x1f;
      iVar1 = (iVar1 * 0x7cb) / 2000 + iVar3;
      iVar2 = Sector::SizeCodeToLength(size_);
      iVar5 = iVar2 + 0x3e;
      iVar6 = (iVar1 + -0x92) - iVar3;
      if (encoding != MFM) {
        iVar5 = iVar2 + 0x21;
        iVar6 = (iVar1 + -0x49) - iVar3;
      }
      iVar3 = iVar6 / sectors - iVar5;
      iVar1 = 0x52;
      if (iVar3 < 0x52) {
        iVar1 = iVar3;
      }
      iVar3 = 0;
      if (iVar5 < iVar6 / sectors) {
        iVar3 = iVar1;
      }
      return iVar3;
    }
  }
  return *(int *)((long)&standard_gaps[0].drivespeed + lVar4);
}

Assistant:

int GetFormatGap(int drive_speed, DataRate datarate, Encoding encoding, int sectors, int size_)
{
    if (!sectors) return 0;

    // Check for common formats that use specific gap sizes
    for (auto& fg : standard_gaps)
    {
        // If the format matches exactly, return the known gap
        if (fg.drivespeed == drive_speed && fg.datarate == datarate && fg.encoding == encoding &&
            fg.sectors == sectors && fg.size == size_)
            return fg.gap3;
    }

    auto track_len = GetTrackCapacity(drive_speed, datarate, encoding) - GetTrackOverhead(encoding);
    auto chunk = track_len / sectors;
    auto overhead = Sector::SizeCodeToLength(size_) + GetSectorOverhead(encoding);
    auto gap3 = (chunk > overhead) ? chunk - overhead : 0;
    return (gap3 > MAX_GAP3) ? MAX_GAP3 : gap3;
}